

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O0

bool __thiscall Hpipe::Cond::always_checked(Cond *this,Cond *not_in)

{
  bool bVar1;
  int local_24;
  int i;
  Cond *not_in_local;
  Cond *this_local;
  
  if (not_in == (Cond *)0x0) {
    this_local._7_1_ = std::bitset<256UL>::all(&this->p);
  }
  else {
    for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
      bVar1 = std::bitset<256UL>::operator[](&not_in->p,(long)local_24);
      if ((!bVar1) && (bVar1 = std::bitset<256UL>::operator[](&this->p,(long)local_24), !bVar1)) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Cond::always_checked( const Cond *not_in ) const {
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i )
            if ( not not_in->p[ i ] and not p[ i ] )
                return false;
        return true;
    }
    return p.all();
}